

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFillBufferTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::FillBufferTestInstance::uploadBuffer
          (FillBufferTestInstance *this,ConstPixelBufferAccess *bufferAccess,Allocation *bufferAlloc
          )

{
  int iVar1;
  DeviceInterface *vkd;
  VkDevice device;
  ulong __n;
  ConstPixelBufferAccess local_58;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_58,bufferAccess);
  iVar1 = tcu::getPixelSize(local_58.m_format);
  __n = (ulong)(uint)(local_58.m_size.m_data[1] * local_58.m_size.m_data[0] *
                      local_58.m_size.m_data[2] * iVar1);
  memcpy(bufferAlloc->m_hostPtr,bufferAccess->m_data,__n);
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)(bufferAlloc->m_memory).m_internal,bufferAlloc->m_offset,__n
            );
  return;
}

Assistant:

void FillBufferTestInstance::uploadBuffer (tcu::ConstPixelBufferAccess bufferAccess, const Allocation& bufferAlloc)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const deUint32				bufferSize	= calculateSize(bufferAccess);

	// Write buffer data
	deMemcpy(bufferAlloc.getHostPtr(), bufferAccess.getDataPtr(), bufferSize);
	flushMappedMemoryRange(vk, vkDevice, bufferAlloc.getMemory(), bufferAlloc.getOffset(), bufferSize);
}